

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddCorr.c
# Opt level: O0

double bddCorrelationAux(DdManager *dd,DdNode *f,DdNode *g,st__table *table)

{
  int iVar1;
  char *key;
  double dVar2;
  uint local_a0;
  uint local_9c;
  DdNode *tmp;
  uint topG;
  uint topF;
  HashEntry *entry;
  double *dummy;
  double min2;
  double min1;
  double *pmin;
  double min;
  DdNode *Gnv;
  DdNode *Gv;
  DdNode *G;
  DdNode *Fnv;
  DdNode *Fv;
  st__table *table_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f == g) {
    dd_local = (DdManager *)0x3ff0000000000000;
  }
  else if (f == (DdNode *)((ulong)g ^ 1)) {
    dd_local = (DdManager *)0x0;
  }
  else {
    table_local = (st__table *)g;
    g_local = f;
    if ((*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)g & 1)) <
        (*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)f & 1))) {
      table_local = (st__table *)f;
      g_local = g;
    }
    if (((ulong)g_local & 1) != 0) {
      g_local = (DdNode *)((ulong)g_local ^ 1);
      table_local = (st__table *)((ulong)table_local ^ 1);
    }
    Fv = (DdNode *)table;
    f_local = &dd->sentinel;
    key = (char *)malloc(0x10);
    if (key == (char *)0x0) {
      *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
      dd_local = (DdManager *)0xbff0000000000000;
    }
    else {
      *(DdNode **)key = g_local;
      *(st__table **)(key + 8) = table_local;
      iVar1 = st__lookup((st__table *)Fv,key,(char **)&entry);
      if (iVar1 == 0) {
        Gv = (DdNode *)((ulong)table_local & 0xfffffffffffffffe);
        if (g_local->index == 0x7fffffff) {
          local_9c = g_local->index;
        }
        else {
          local_9c = *(uint *)(f_local[7].Id + (ulong)g_local->index * 4);
        }
        if (*(DdHalfWord *)&((st__table *)Gv)->compare == 0x7fffffff) {
          local_a0 = *(uint *)&((st__table *)Gv)->compare;
        }
        else {
          local_a0 = *(uint *)(f_local[7].Id + (ulong)*(uint *)&((st__table *)Gv)->compare * 4);
        }
        if (local_a0 < local_9c) {
          G = g_local;
          Fnv = g_local;
        }
        else {
          Fnv = (g_local->type).kids.T;
          G = (g_local->type).kids.E;
        }
        min = (double)Gv;
        Gnv = Gv;
        if (local_a0 <= local_9c) {
          min = *(double *)&((st__table *)Gv)->max_density;
          Gnv = (((anon_union_16_2_50f58667_for_type *)&((st__table *)Gv)->num_bins)->kids).T;
        }
        if (table_local != (st__table *)Gv) {
          Gnv = (DdNode *)((ulong)Gnv ^ 1);
          min = (double)((ulong)min ^ 1);
        }
        dVar2 = bddCorrelationAux((DdManager *)f_local,Fnv,Gnv,(st__table *)Fv);
        min2 = dVar2 / 2.0;
        if ((min2 != -1.0) || (NAN(min2))) {
          dVar2 = bddCorrelationAux((DdManager *)f_local,G,(DdNode *)min,(st__table *)Fv);
          dummy = (double *)(dVar2 / 2.0);
          if (((double)dummy != -1.0) || (NAN((double)dummy))) {
            pmin = (double *)(min2 + (double)dummy);
            min1 = (double)malloc(8);
            if ((char *)min1 == (char *)0x0) {
              *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
              dd_local = (DdManager *)0xbff0000000000000;
            }
            else {
              *(double **)min1 = pmin;
              iVar1 = st__insert((st__table *)Fv,key,(char *)min1);
              if (iVar1 == -10000) {
                if (key != (char *)0x0) {
                  free(key);
                }
                if (min1 != 0.0) {
                  free((void *)min1);
                }
                dd_local = (DdManager *)0xbff0000000000000;
              }
              else {
                dd_local = (DdManager *)pmin;
              }
            }
          }
          else {
            if (key != (char *)0x0) {
              free(key);
            }
            dd_local = (DdManager *)0xbff0000000000000;
          }
        }
        else {
          if (key != (char *)0x0) {
            free(key);
          }
          dd_local = (DdManager *)0xbff0000000000000;
        }
      }
      else {
        pmin = (double *)entry->f;
        if (key != (char *)0x0) {
          free(key);
        }
        dd_local = (DdManager *)pmin;
      }
    }
  }
  return (double)dd_local;
}

Assistant:

static double
bddCorrelationAux(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  st__table * table)
{
    DdNode      *Fv, *Fnv, *G, *Gv, *Gnv;
    double      min, *pmin, min1, min2, *dummy;
    HashEntry   *entry;
    unsigned int topF, topG;

    statLine(dd);
#ifdef CORREL_STATS
    num_calls++;
#endif

    /* Terminal cases: only work for BDDs. */
    if (f == g) return(1.0);
    if (f == Cudd_Not(g)) return(0.0);

    /* Standardize call using the following properties:
    **     (f EXNOR g)   = (g EXNOR f)
    **     (f' EXNOR g') = (f EXNOR g).
    */
    if (cuddF2L(f) > cuddF2L(g)) {
        DdNode *tmp = f;
        f = g; g = tmp;
    }
    if (Cudd_IsComplement(f)) {
        f = Cudd_Not(f);
        g = Cudd_Not(g);
    }
    /* From now on, f is regular. */
    
    entry = ABC_ALLOC(HashEntry,1);
    if (entry == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(CUDD_OUT_OF_MEM);
    }
    entry->f = f; entry->g = g;

    /* We do not use the fact that
    ** correlation(f,g') = 1 - correlation(f,g)
    ** to minimize the risk of cancellation.
    */
    if ( st__lookup(table, (const char *)entry, (char **)&dummy)) {
        min = *dummy;
        ABC_FREE(entry);
        return(min);
    }

    G = Cudd_Regular(g);
    topF = cuddI(dd,f->index); topG = cuddI(dd,G->index);
    if (topF <= topG) { Fv = cuddT(f); Fnv = cuddE(f); } else { Fv = Fnv = f; }
    if (topG <= topF) { Gv = cuddT(G); Gnv = cuddE(G); } else { Gv = Gnv = G; }

    if (g != G) {
        Gv = Cudd_Not(Gv);
        Gnv = Cudd_Not(Gnv);
    }

    min1 = bddCorrelationAux(dd, Fv, Gv, table) / 2.0;
    if (min1 == (double)CUDD_OUT_OF_MEM) {
        ABC_FREE(entry);
        return(CUDD_OUT_OF_MEM);
    }
    min2 = bddCorrelationAux(dd, Fnv, Gnv, table) / 2.0; 
    if (min2 == (double)CUDD_OUT_OF_MEM) {
        ABC_FREE(entry);
        return(CUDD_OUT_OF_MEM);
    }
    min = (min1+min2);
    
    pmin = ABC_ALLOC(double,1);
    if (pmin == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return((double)CUDD_OUT_OF_MEM);
    }
    *pmin = min;

    if ( st__insert(table,(char *)entry, (char *)pmin) == st__OUT_OF_MEM) {
        ABC_FREE(entry);
        ABC_FREE(pmin);
        return((double)CUDD_OUT_OF_MEM);
    }
    return(min);

}